

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O1

size_t io::net::read<io::basic_string_stream<char,std::char_traits<char>>,io::net::transfer_all>
                 (memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                  *stream,long *buffer,error_code *param_3)

{
  ulong uVar1;
  ulong uVar2;
  error_category *peVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  mutable_buffer buf;
  mutable_buffer local_40;
  
  peVar3 = (error_category *)std::_V2::system_category();
  param_3->_M_value = 0;
  param_3->_M_cat = peVar3;
  uVar1 = buffer[1];
  uVar5 = 0;
  if (uVar1 != 0) {
    do {
      uVar2 = buffer[1];
      uVar6 = uVar5;
      if (uVar2 < uVar5) {
        uVar6 = uVar2;
      }
      local_40.size_ = uVar2 - uVar6;
      local_40.data_ = (void *)(uVar6 + *buffer);
      sVar4 = detail::
              memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>::
              read_some<io::net::mutable_buffer>(stream,&local_40,param_3);
      uVar5 = sVar4 + uVar5;
    } while ((param_3->_M_value == 0) && (uVar5 < uVar1));
  }
  return uVar5;
}

Assistant:

std::size_t read(SyncReadStream& stream,
                 const mutable_buffer& buffer,
                 CompletionCondition completion_condition,
                 std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_read = 0;
    std::size_t next_read_size = max_single_transfer_size;
    std::size_t buf_size = buffer_size(buffer);

    while (total_bytes_read < buf_size && next_read_size != 0) {
        mutable_buffer buf = buffer + total_bytes_read;
        total_bytes_read += stream.read_some(buf, ec);
        next_read_size = completion_condition(ec, total_bytes_read);
    }

    return total_bytes_read;

}